

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

bool __thiscall
prometheus::Registry::NameExistsInOtherType<prometheus::Counter>(Registry *this,string *name)

{
  unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
  *puVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
  __it;
  long lVar4;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
  __it_00;
  
  __it_00._M_current =
       (this->gauges_).
       super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->gauges_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)__it_00._M_current;
  if (0 < lVar4 >> 5) {
    lVar3 = (lVar4 >> 5) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_001114cc;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_001114cc;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_001114cc;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_001114cc;
      __it_00._M_current = __it_00._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x20;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar4 != 2) {
      __it._M_current = puVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
                  ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                                *)name,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_001114cc;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                          *)name,__it);
    if (bVar2) goto LAB_001114cc;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat...us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
          ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocat___us::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                        *)name,__it_00);
  __it._M_current = puVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_001114cc:
  if (__it._M_current ==
      (this->gauges_).
      super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = (anonymous_namespace)::
            FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>
                      (name,&this->histograms_,&this->infos_,&this->summaries_);
    return bVar2;
  }
  return true;
}

Assistant:

bool Registry::NameExistsInOtherType<Counter>(const std::string& name) const {
  return FamilyNameExists(name, gauges_, histograms_, infos_, summaries_);
}